

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_sstream.c
# Opt level: O1

double HTS_set_specified_duration
                 (size_t *duration,double *mean,double *vari,size_t size,double frame_length)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  dVar10 = 1.0;
  if (1.0 <= frame_length + 0.5) {
    dVar10 = frame_length + 0.5;
  }
  uVar2 = (long)(dVar10 - 9.223372036854776e+18) & (long)dVar10 >> 0x3f | (long)dVar10;
  if (size < uVar2) {
    if (size == 0) {
      dVar14 = 0.0;
      dVar15 = 0.0;
    }
    else {
      dVar15 = 0.0;
      sVar3 = 0;
      dVar14 = 0.0;
      do {
        dVar14 = dVar14 + mean[sVar3];
        dVar15 = dVar15 + vari[sVar3];
        sVar3 = sVar3 + 1;
      } while (size != sVar3);
    }
    auVar16._8_4_ = (int)(uVar2 >> 0x20);
    auVar16._0_8_ = uVar2;
    auVar16._12_4_ = 0x45300000;
    dVar10 = (auVar16._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
    dVar15 = (dVar10 - dVar14) / dVar15;
    uVar4 = 0;
    if (size != 0) {
      sVar3 = 0;
      do {
        dVar14 = vari[sVar3] * dVar15 + mean[sVar3] + 0.5;
        dVar17 = 1.0;
        if (1.0 <= dVar14) {
          dVar17 = dVar14;
        }
        uVar9 = (long)(dVar17 - 9.223372036854776e+18) & (long)dVar17 >> 0x3f | (long)dVar17;
        duration[sVar3] = uVar9;
        uVar4 = uVar4 + uVar9;
        sVar3 = sVar3 + 1;
      } while (size != sVar3);
    }
    for (; uVar4 != uVar2; uVar4 = uVar4 + lVar5) {
      if (uVar4 < uVar2) {
        lVar5 = 1;
        if (size == 0) {
LAB_001068be:
          lVar7 = -1;
        }
        else {
          uVar9 = 0xffffffff;
          uVar6 = 0;
          do {
            sVar3 = duration[uVar6];
            auVar18._8_4_ = (int)(sVar3 >> 0x20);
            auVar18._0_8_ = sVar3;
            auVar18._12_4_ = 0x45300000;
            dVar17 = ABS(dVar15 - (((auVar18._8_8_ - 1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0) +
                                   1.0) - mean[uVar6]) / vari[uVar6]);
            uVar1 = uVar6 & 0xffffffff;
            if (dVar14 <= dVar17 && -1 < (int)uVar9) {
              dVar17 = dVar14;
              uVar1 = uVar9;
            }
            uVar9 = uVar1;
            dVar14 = dVar17;
            uVar6 = uVar6 + 1;
          } while (size != uVar6);
          lVar7 = (long)(int)uVar9;
        }
      }
      else {
        lVar5 = -1;
        if (size == 0) goto LAB_001068be;
        iVar8 = -1;
        sVar3 = 0;
        do {
          uVar9 = duration[sVar3];
          if ((1 < uVar9) &&
             ((auVar19._8_4_ = (int)(uVar9 >> 0x20), auVar19._0_8_ = uVar9,
              auVar19._12_4_ = 0x45300000,
              dVar17 = ABS(dVar15 - (((auVar19._8_8_ - 1.9342813113834067e+25) +
                                      ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0)
                                     + -1.0) - mean[sVar3]) / vari[sVar3]), iVar8 < 0 ||
              (dVar17 < dVar14)))) {
            iVar8 = (int)sVar3;
            dVar14 = dVar17;
          }
          sVar3 = sVar3 + 1;
        } while (size != sVar3);
        lVar7 = (long)iVar8;
      }
      duration[lVar7] = duration[lVar7] + lVar5;
    }
  }
  else {
    if (uVar2 < size) {
      HTS_error(-1,"HTS_set_specified_duration: Specified frame length is too short.\n");
    }
    auVar13 = _DAT_0010dc00;
    if (size != 0) {
      lVar5 = size - 1;
      auVar11._8_4_ = (int)lVar5;
      auVar11._0_8_ = lVar5;
      auVar11._12_4_ = (int)((ulong)lVar5 >> 0x20);
      uVar2 = 0;
      auVar11 = auVar11 ^ _DAT_0010dc00;
      auVar12 = _DAT_0010dbf0;
      do {
        auVar16 = auVar12 ^ auVar13;
        if ((bool)(~(auVar16._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar16._0_4_ ||
                    auVar11._4_4_ < auVar16._4_4_) & 1)) {
          duration[uVar2] = 1;
        }
        if ((auVar16._12_4_ != auVar11._12_4_ || auVar16._8_4_ <= auVar11._8_4_) &&
            auVar16._12_4_ <= auVar11._12_4_) {
          duration[uVar2 + 1] = 1;
        }
        uVar2 = uVar2 + 2;
        lVar5 = auVar12._8_8_;
        auVar12._0_8_ = auVar12._0_8_ + 2;
        auVar12._8_8_ = lVar5 + 2;
      } while ((size + 1 & 0xfffffffffffffffe) != uVar2);
    }
    auVar13._8_4_ = (int)(size >> 0x20);
    auVar13._0_8_ = size;
    auVar13._12_4_ = 0x45300000;
    dVar10 = (auVar13._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)size) - 4503599627370496.0);
  }
  return dVar10;
}

Assistant:

static double HTS_set_specified_duration(size_t * duration, double *mean, double *vari, size_t size, double frame_length)
{
   size_t i;
   int j;
   double temp1, temp2;
   double rho = 0.0;
   size_t sum = 0;
   size_t target_length;

   /* get the target frame length */
   if (frame_length + 0.5 < 1.0)
      target_length = 1;
   else
      target_length = (size_t) (frame_length + 0.5);

   /* check the specified duration */
   if (target_length <= size) {
      if (target_length < size)
         HTS_error(-1, "HTS_set_specified_duration: Specified frame length is too short.\n");
      for (i = 0; i < size; i++)
         duration[i] = 1;
      return (double) size;
   }

   /* RHO calculation */
   temp1 = 0.0;
   temp2 = 0.0;
   for (i = 0; i < size; i++) {
      temp1 += mean[i];
      temp2 += vari[i];
   }
   rho = ((double) target_length - temp1) / temp2;

   /* first estimation */
   for (i = 0; i < size; i++) {
      temp1 = mean[i] + rho * vari[i] + 0.5;
      if (temp1 < 1.0)
         duration[i] = 1;
      else
         duration[i] = (size_t) temp1;
      sum += duration[i];
   }

   /* loop estimation */
   while (target_length != sum) {
      /* sarch flexible state and modify its duration */
      if (target_length > sum) {
         j = -1;
         for (i = 0; i < size; i++) {
            temp2 = fabs(rho - ((double) duration[i] + 1 - mean[i]) / vari[i]);
            if (j < 0 || temp1 > temp2) {
               j = i;
               temp1 = temp2;
            }
         }
         sum++;
         duration[j]++;
      } else {
         j = -1;
         for (i = 0; i < size; i++) {
            if (duration[i] > 1) {
               temp2 = fabs(rho - ((double) duration[i] - 1 - mean[i]) / vari[i]);
               if (j < 0 || temp1 > temp2) {
                  j = i;
                  temp1 = temp2;
               }
            }
         }
         sum--;
         duration[j]--;
      }
   }

   return (double) target_length;
}